

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EdgeSensitivePathSuffixSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeSensitivePathSuffixSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,SeparatedSyntaxList<slang::syntax::NameSyntax> *args_1,
          Token *args_2,Token *args_3,ExpressionSyntax *args_4,Token *args_5)

{
  Token polarityOperator;
  Token openParen;
  Token colon;
  Token closeParen;
  EdgeSensitivePathSuffixSyntax *this_00;
  
  this_00 = (EdgeSensitivePathSuffixSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((EdgeSensitivePathSuffixSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (EdgeSensitivePathSuffixSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  polarityOperator.kind = args_2->kind;
  polarityOperator._2_1_ = args_2->field_0x2;
  polarityOperator.numFlags.raw = (args_2->numFlags).raw;
  polarityOperator.rawLen = args_2->rawLen;
  polarityOperator.info = args_2->info;
  closeParen.kind = args_5->kind;
  closeParen._2_1_ = args_5->field_0x2;
  closeParen.numFlags.raw = (args_5->numFlags).raw;
  closeParen.rawLen = args_5->rawLen;
  closeParen.info = args_5->info;
  colon.kind = args_3->kind;
  colon._2_1_ = args_3->field_0x2;
  colon.numFlags.raw = (args_3->numFlags).raw;
  colon.rawLen = args_3->rawLen;
  colon.info = args_3->info;
  slang::syntax::EdgeSensitivePathSuffixSyntax::EdgeSensitivePathSuffixSyntax
            (this_00,openParen,args_1,polarityOperator,colon,args_4,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }